

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O2

void invert_L8(uchar *L,int n)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int k;
  long lVar7;
  uchar *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  byte local_4c;
  
  lVar9 = (long)(n / 8);
  iVar3 = 2;
  lVar11 = lVar9;
  for (uVar4 = 1; (long)uVar4 < (long)n; uVar4 = uVar4 + 1) {
    lVar12 = (long)iVar3;
    lVar10 = lVar9 * lVar12;
    uVar5 = (uint)uVar4 - 1;
    uVar6 = (ulong)(uVar5 >> 3);
    cVar2 = (char)(0x80 >> ((byte)uVar5 & 7));
    local_4c = cVar2 - 1;
    for (; lVar12 < n; lVar12 = lVar12 + 1) {
      bVar1 = -((L[(int)(((int)lVar12 * n) / 8 + ((uint)(uVar4 >> 3) & 0x1fffffff))] >>
                 (~(uint)uVar4 & 7) & 1) != 0);
      puVar8 = L;
      for (lVar7 = 0; lVar7 <= (long)(uVar4 - 9); lVar7 = lVar7 + 8) {
        puVar8[lVar10] = puVar8[lVar10] ^ puVar8[lVar11] & bVar1;
        puVar8 = puVar8 + 1;
      }
      L[lVar12 * lVar9 + uVar6] =
           (bVar1 & L[uVar6 + uVar4 * lVar9] ^ L[lVar12 * lVar9 + uVar6]) & -cVar2 |
           L[lVar12 * lVar9 + uVar6] & local_4c;
      lVar10 = lVar10 + lVar9;
    }
    iVar3 = iVar3 + 1;
    lVar11 = lVar11 + lVar9;
  }
  return;
}

Assistant:

void invert_L8(unsigned char *L, int n)
{
  /*
   * inversion == forward substitution
   *
   * For all columns c = 1 ... n-1
   *   For all rows c+1 ... n-1
   *     add (row c) * (leading (c'th) element of row r) to row r.
   *       only do it for the k elements k = 0 ... c-1
   */

  for(int c = 1; c <= n-1; c++)
  {
    /*
     * Basically:
     *      copy elements 0 to c-1  from c'th row to r'th row iff leading element of row r is 1
     */
    for(int r = c+1; r <= n-1; r++)
    {
      /*
       * first copy all "full bytes" at the left
       */
      unsigned char mask_rc = 0x00 - ((L[r*n/8 + (c/8)] >> (7 - (c % 8))) & 1); // mask for the element U(r,c)
      for(int k = 0; k <= c-1 - 8; k += 8)
      {
        L[r*(n/8) + k/8] ^= mask_rc & L[c*(n/8) + k/8];
      }

      /*
       * then handle the right-most "partial byte"
       */
      int k = c-1;
      unsigned char mask_prepending = ((unsigned char) (0x80 >> (k % 8)) - 1);

      unsigned char tmp_rk = L[r*(n/8) + k/8] & mask_prepending; // store the right side of the splitted byte in tmp
      L[r*(n/8) + k/8]  ^= (mask_rc & L[c*(n/8) + k/8]);

      // restore the right bits: first set bits 0, then 'or' tmp
      L[r*(n/8) + k/8] &= ~mask_prepending;
      L[r*(n/8) + k/8] |= tmp_rk;
    }
  }
}